

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall
kj::_::EagerPromiseNodeBase::fire(EagerPromiseNodeBase *this)

{
  ExceptionOrValue *this_00;
  PromiseNode *pPVar1;
  NullableValue<kj::Exception> *other;
  Exception *pEVar2;
  anon_class_8_1_8991fb9c *func;
  Event *extraout_RDX;
  long in_RSI;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar3;
  Exception *exception;
  undefined1 local_350 [416];
  undefined1 local_1b0 [8];
  NullableValue<kj::Exception> _exception3102;
  EagerPromiseNodeBase *this_local;
  
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->
                     ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(in_RSI + 0x50));
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[3])
            (pPVar1,*(undefined8 *)(in_RSI + 0x60));
  runCatchingExceptions<kj::_::EagerPromiseNodeBase::fire()::__0>
            ((Maybe<kj::Exception> *)(local_350 + 8),(kj *)local_350,func);
  other = readMaybe<kj::Exception>((Maybe<kj::Exception> *)(local_350 + 8));
  NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_1b0,other);
  Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)(local_350 + 8));
  pEVar2 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1b0);
  if (pEVar2 != (Exception *)0x0) {
    pEVar2 = NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_1b0);
    this_00 = *(ExceptionOrValue **)(in_RSI + 0x60);
    pEVar2 = mv<kj::Exception>(pEVar2);
    ExceptionOrValue::addException(this_00,pEVar2);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1b0);
  PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(in_RSI + 0x58));
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>::Maybe
            ((Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> *)this);
  MVar3.ptr.ptr = extraout_RDX;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<Event>> EagerPromiseNodeBase::fire() {
  dependency->get(resultRef);
  KJ_IF_SOME(exception, kj::runCatchingExceptions([this]() {
    dependency = nullptr;
  })) {
    resultRef.addException(kj::mv(exception));
  }

  onReadyEvent.arm();
  return kj::none;
}